

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

int LoadEXRFromMemory(float **out_rgba,int *width,int *height,uchar *memory,size_t size,char **err)

{
  uchar **ppuVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  ostream *poVar5;
  long lVar6;
  float *pfVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  char *pcVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  EXRChannelInfo *__s1;
  int *piVar15;
  float fVar16;
  EXRImage exr_image;
  EXRVersion exr_version;
  EXRHeader exr_header;
  stringstream ss;
  int local_3cc;
  long local_3c8;
  int local_3bc;
  EXRImage local_3b8;
  int *local_388;
  int *local_380;
  EXRVersion local_374;
  char *local_360;
  char local_350 [16];
  int *local_340 [2];
  int local_330 [10];
  int local_308;
  int local_304;
  int local_300;
  EXRChannelInfo *local_2d8;
  int *local_2d0;
  int local_2c8;
  int *local_2c0;
  ostream *local_1b8 [2];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  if (out_rgba == (float **)0x0 || memory == (uchar *)0x0) {
    piVar15 = (int *)((long)&((EXRHeader *)local_340)->data_window + 8);
    local_340[0] = piVar15;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_340,"Invalid argument for LoadEXRFromMemory","");
    if (err != (char **)0x0) {
      pcVar4 = strdup((char *)local_340[0]);
      *err = pcVar4;
    }
    if (local_340[0] != piVar15) {
      operator_delete(local_340[0]);
    }
    return -3;
  }
  local_380 = width;
  memset((EXRHeader *)local_340,0,0x188);
  iVar2 = ParseEXRVersionFromMemory(&local_374,memory,size);
  if (iVar2 != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"Failed to parse EXR version. code(",0x22);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
    std::__cxx11::stringbuf::str();
    if (err != (char **)0x0) {
      pcVar4 = strdup(local_360);
      *err = pcVar4;
    }
    if (local_360 != local_350) {
      operator_delete(local_360);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
    return iVar2;
  }
  iVar2 = ParseEXRHeaderFromMemory((EXRHeader *)local_340,&local_374,memory,size,err);
  if (iVar2 != 0) {
    return iVar2;
  }
  if (0 < local_2c8) {
    lVar6 = 0;
    do {
      if (local_2d0[lVar6] == 1) {
        local_2c0[lVar6] = 2;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < local_2c8);
  }
  local_3b8.width = 0;
  local_3b8.height = 0;
  local_3b8.num_channels = 0;
  local_3b8.num_tiles = 0;
  local_3b8.level_x = 0;
  local_3b8.level_y = 0;
  local_3b8.images = (uchar **)0x0;
  local_3b8.tiles = (EXRTile *)0x0;
  local_3b8.next_level = (TEXRImage *)0x0;
  iVar2 = LoadEXRImageFromMemory(&local_3b8,(EXRHeader *)local_340,memory,size,err);
  if (iVar2 != 0) {
    return iVar2;
  }
  local_388 = height;
  if ((long)local_2c8 < 1) {
    iVar2 = -1;
    local_3bc = -1;
    local_3cc = -1;
    local_3c8._0_4_ = -1;
  }
  else {
    local_3c8._0_4_ = -1;
    uVar9 = 0;
    local_3cc = -1;
    local_3bc = -1;
    uVar8 = 0xffffffff;
    __s1 = local_2d8;
    do {
      iVar3 = strcmp(__s1->name,"R");
      iVar14 = (int)uVar9;
      iVar2 = local_3cc;
      iVar10 = local_3bc;
      iVar12 = iVar14;
      if ((((iVar3 != 0) &&
           (iVar3 = strcmp(__s1->name,"G"), iVar2 = iVar14, iVar12 = (int)local_3c8, iVar3 != 0)) &&
          (iVar3 = strcmp(__s1->name,"B"), iVar2 = local_3cc, iVar10 = iVar14, iVar3 != 0)) &&
         (iVar3 = strcmp(__s1->name,"A"), iVar10 = local_3bc, iVar3 == 0)) {
        uVar8 = uVar9 & 0xffffffff;
      }
      local_3c8._0_4_ = iVar12;
      local_3bc = iVar10;
      local_3cc = iVar2;
      iVar2 = (int)uVar8;
      uVar9 = uVar9 + 1;
      __s1 = __s1 + 1;
    } while ((long)local_2c8 != uVar9);
  }
  piVar15 = local_388;
  if (local_2c8 == 1) {
    pfVar7 = (float *)malloc((long)local_3b8.height * (long)local_3b8.width * 0x10);
    *out_rgba = pfVar7;
    piVar15 = local_388;
    if (local_308 == 0) {
      if (0 < local_3b8.height * local_3b8.width) {
        lVar6 = 0;
        lVar13 = 0;
        do {
          fVar16 = *(float *)(*local_3b8.images + lVar6);
          (*out_rgba)[lVar6] = fVar16;
          (*out_rgba)[lVar6 + 1] = fVar16;
          (*out_rgba)[lVar6 + 2] = fVar16;
          (*out_rgba)[lVar6 + 3] = fVar16;
          lVar13 = lVar13 + 1;
          lVar6 = lVar6 + 4;
        } while (lVar13 < (long)local_3b8.height * (long)local_3b8.width);
      }
    }
    else if (0 < local_3b8.num_tiles) {
      lVar6 = 0;
      do {
        if (0 < local_300) {
          iVar2 = 0;
          do {
            if (0 < local_304) {
              iVar10 = 0;
              do {
                iVar12 = local_3b8.tiles[lVar6].offset_x * local_304 + iVar10;
                if ((iVar12 < local_3b8.width) &&
                   (iVar3 = local_300 * local_3b8.tiles[lVar6].offset_y + iVar2,
                   iVar3 < local_3b8.height)) {
                  iVar12 = iVar12 + local_3b8.width * iVar3;
                  ppuVar1 = local_3b8.tiles[lVar6].images;
                  lVar13 = (long)(local_304 * iVar2 + iVar10);
                  (*out_rgba)[iVar12 * 4] = *(float *)(*ppuVar1 + lVar13 * 4);
                  (*out_rgba)[iVar12 * 4 + 1] = *(float *)(*ppuVar1 + lVar13 * 4);
                  (*out_rgba)[iVar12 * 4 + 2] = *(float *)(*ppuVar1 + lVar13 * 4);
                  (*out_rgba)[iVar12 * 4 + 3] = *(float *)(*ppuVar1 + lVar13 * 4);
                }
                iVar10 = iVar10 + 1;
              } while (iVar10 < local_304);
            }
            iVar2 = iVar2 + 1;
          } while (iVar2 < local_300);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < local_3b8.num_tiles);
    }
LAB_001c728d:
    *local_380 = local_3b8.width;
    *piVar15 = local_3b8.height;
    FreeEXRHeader((EXRHeader *)local_340);
    FreeEXRImage(&local_3b8);
    iVar2 = 0;
  }
  else {
    if ((int)local_3c8 == -1) {
      pcVar11 = "R channel not found";
      pcVar4 = "";
    }
    else if (local_3cc == -1) {
      pcVar11 = "G channel not found";
      pcVar4 = "";
    }
    else {
      if (local_3bc != -1) {
        pfVar7 = (float *)malloc((long)local_3b8.height * (long)local_3b8.width * 0x10);
        *out_rgba = pfVar7;
        if (local_308 == 0) {
          if (0 < local_3b8.height * local_3b8.width) {
            lVar6 = 0;
            lVar13 = 0;
            do {
              (*out_rgba)[lVar6] = *(float *)(local_3b8.images[(int)local_3c8] + lVar6);
              (*out_rgba)[lVar6 + 1] = *(float *)(local_3b8.images[local_3cc] + lVar6);
              (*out_rgba)[lVar6 + 2] = *(float *)(local_3b8.images[local_3bc] + lVar6);
              fVar16 = 1.0;
              if (iVar2 != -1) {
                fVar16 = *(float *)(local_3b8.images[iVar2] + lVar6);
              }
              (*out_rgba)[lVar6 + 3] = fVar16;
              lVar13 = lVar13 + 1;
              lVar6 = lVar6 + 4;
            } while (lVar13 < (long)local_3b8.height * (long)local_3b8.width);
          }
        }
        else if (0 < local_3b8.num_tiles) {
          lVar6 = (long)(int)local_3c8;
          local_3c8 = 0;
          do {
            if (0 < local_300) {
              iVar10 = 0;
              do {
                if (0 < local_304) {
                  iVar12 = 0;
                  do {
                    iVar3 = local_3b8.tiles[local_3c8].offset_x * local_304 + iVar12;
                    if ((iVar3 < local_3b8.width) &&
                       (iVar14 = local_300 * local_3b8.tiles[local_3c8].offset_y + iVar10,
                       iVar14 < local_3b8.height)) {
                      iVar3 = iVar3 + local_3b8.width * iVar14;
                      ppuVar1 = local_3b8.tiles[local_3c8].images;
                      lVar13 = (long)(local_304 * iVar10 + iVar12);
                      (*out_rgba)[iVar3 * 4] = *(float *)(ppuVar1[lVar6] + lVar13 * 4);
                      (*out_rgba)[iVar3 * 4 + 1] = *(float *)(ppuVar1[local_3cc] + lVar13 * 4);
                      (*out_rgba)[iVar3 * 4 + 2] = *(float *)(ppuVar1[local_3bc] + lVar13 * 4);
                      fVar16 = 1.0;
                      if (iVar2 != -1) {
                        fVar16 = *(float *)(ppuVar1[iVar2] + lVar13 * 4);
                      }
                      (*out_rgba)[(int)(iVar3 * 4 | 3)] = fVar16;
                    }
                    iVar12 = iVar12 + 1;
                  } while (iVar12 < local_304);
                }
                iVar10 = iVar10 + 1;
              } while (iVar10 < local_300);
            }
            local_3c8 = local_3c8 + 1;
            piVar15 = local_388;
          } while (local_3c8 < local_3b8.num_tiles);
        }
        goto LAB_001c728d;
      }
      pcVar11 = "B channel not found";
      pcVar4 = "";
    }
    local_1b8[0] = local_1a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,pcVar11,pcVar4);
    if (err != (char **)0x0) {
      pcVar4 = strdup((char *)local_1b8[0]);
      *err = pcVar4;
    }
    if (local_1b8[0] != local_1a8) {
      operator_delete(local_1b8[0]);
    }
    iVar2 = -4;
  }
  return iVar2;
}

Assistant:

int LoadEXRFromMemory(float **out_rgba, int *width, int *height,
                      const unsigned char *memory, size_t size,
                      const char **err) {
  if (out_rgba == NULL || memory == NULL) {
    tinyexr::SetErrorMessage("Invalid argument for LoadEXRFromMemory", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  EXRVersion exr_version;
  EXRImage exr_image;
  EXRHeader exr_header;

  InitEXRHeader(&exr_header);

  int ret = ParseEXRVersionFromMemory(&exr_version, memory, size);
  if (ret != TINYEXR_SUCCESS) {
    std::stringstream ss;
    ss << "Failed to parse EXR version. code(" << ret << ")";
    tinyexr::SetErrorMessage(ss.str(), err);
    return ret;
  }

  ret = ParseEXRHeaderFromMemory(&exr_header, &exr_version, memory, size, err);
  if (ret != TINYEXR_SUCCESS) {
    return ret;
  }

  // Read HALF channel as FLOAT.
  for (int i = 0; i < exr_header.num_channels; i++) {
    if (exr_header.pixel_types[i] == TINYEXR_PIXELTYPE_HALF) {
      exr_header.requested_pixel_types[i] = TINYEXR_PIXELTYPE_FLOAT;
    }
  }

  InitEXRImage(&exr_image);
  ret = LoadEXRImageFromMemory(&exr_image, &exr_header, memory, size, err);
  if (ret != TINYEXR_SUCCESS) {
    return ret;
  }

  // RGBA
  int idxR = -1;
  int idxG = -1;
  int idxB = -1;
  int idxA = -1;
  for (int c = 0; c < exr_header.num_channels; c++) {
    if (strcmp(exr_header.channels[c].name, "R") == 0) {
      idxR = c;
    } else if (strcmp(exr_header.channels[c].name, "G") == 0) {
      idxG = c;
    } else if (strcmp(exr_header.channels[c].name, "B") == 0) {
      idxB = c;
    } else if (strcmp(exr_header.channels[c].name, "A") == 0) {
      idxA = c;
    }
  }

  // TODO(syoyo): Refactor removing same code as used in LoadEXR().
  if (exr_header.num_channels == 1) {
    // Grayscale channel only.

    (*out_rgba) = reinterpret_cast<float *>(
        malloc(4 * sizeof(float) * static_cast<size_t>(exr_image.width) *
               static_cast<size_t>(exr_image.height)));

    if (exr_header.tiled) {
      for (int it = 0; it < exr_image.num_tiles; it++) {
        for (int j = 0; j < exr_header.tile_size_y; j++) {
          for (int i = 0; i < exr_header.tile_size_x; i++) {
            const int ii =
                exr_image.tiles[it].offset_x * exr_header.tile_size_x + i;
            const int jj =
                exr_image.tiles[it].offset_y * exr_header.tile_size_y + j;
            const int idx = ii + jj * exr_image.width;

            // out of region check.
            if (ii >= exr_image.width) {
              continue;
            }
            if (jj >= exr_image.height) {
              continue;
            }
            const int srcIdx = i + j * exr_header.tile_size_x;
            unsigned char **src = exr_image.tiles[it].images;
            (*out_rgba)[4 * idx + 0] =
                reinterpret_cast<float **>(src)[0][srcIdx];
            (*out_rgba)[4 * idx + 1] =
                reinterpret_cast<float **>(src)[0][srcIdx];
            (*out_rgba)[4 * idx + 2] =
                reinterpret_cast<float **>(src)[0][srcIdx];
            (*out_rgba)[4 * idx + 3] =
                reinterpret_cast<float **>(src)[0][srcIdx];
          }
        }
      }
    } else {
      for (int i = 0; i < exr_image.width * exr_image.height; i++) {
        const float val = reinterpret_cast<float **>(exr_image.images)[0][i];
        (*out_rgba)[4 * i + 0] = val;
        (*out_rgba)[4 * i + 1] = val;
        (*out_rgba)[4 * i + 2] = val;
        (*out_rgba)[4 * i + 3] = val;
      }
    }

  } else {
    // TODO(syoyo): Support non RGBA image.

    if (idxR == -1) {
      tinyexr::SetErrorMessage("R channel not found", err);

      // @todo { free exr_image }
      return TINYEXR_ERROR_INVALID_DATA;
    }

    if (idxG == -1) {
      tinyexr::SetErrorMessage("G channel not found", err);
      // @todo { free exr_image }
      return TINYEXR_ERROR_INVALID_DATA;
    }

    if (idxB == -1) {
      tinyexr::SetErrorMessage("B channel not found", err);
      // @todo { free exr_image }
      return TINYEXR_ERROR_INVALID_DATA;
    }

    (*out_rgba) = reinterpret_cast<float *>(
        malloc(4 * sizeof(float) * static_cast<size_t>(exr_image.width) *
               static_cast<size_t>(exr_image.height)));

    if (exr_header.tiled) {
      for (int it = 0; it < exr_image.num_tiles; it++) {
        for (int j = 0; j < exr_header.tile_size_y; j++)
          for (int i = 0; i < exr_header.tile_size_x; i++) {
            const int ii =
                exr_image.tiles[it].offset_x * exr_header.tile_size_x + i;
            const int jj =
                exr_image.tiles[it].offset_y * exr_header.tile_size_y + j;
            const int idx = ii + jj * exr_image.width;

            // out of region check.
            if (ii >= exr_image.width) {
              continue;
            }
            if (jj >= exr_image.height) {
              continue;
            }
            const int srcIdx = i + j * exr_header.tile_size_x;
            unsigned char **src = exr_image.tiles[it].images;
            (*out_rgba)[4 * idx + 0] =
                reinterpret_cast<float **>(src)[idxR][srcIdx];
            (*out_rgba)[4 * idx + 1] =
                reinterpret_cast<float **>(src)[idxG][srcIdx];
            (*out_rgba)[4 * idx + 2] =
                reinterpret_cast<float **>(src)[idxB][srcIdx];
            if (idxA != -1) {
              (*out_rgba)[4 * idx + 3] =
                  reinterpret_cast<float **>(src)[idxA][srcIdx];
            } else {
              (*out_rgba)[4 * idx + 3] = 1.0;
            }
          }
      }
    } else {
      for (int i = 0; i < exr_image.width * exr_image.height; i++) {
        (*out_rgba)[4 * i + 0] =
            reinterpret_cast<float **>(exr_image.images)[idxR][i];
        (*out_rgba)[4 * i + 1] =
            reinterpret_cast<float **>(exr_image.images)[idxG][i];
        (*out_rgba)[4 * i + 2] =
            reinterpret_cast<float **>(exr_image.images)[idxB][i];
        if (idxA != -1) {
          (*out_rgba)[4 * i + 3] =
              reinterpret_cast<float **>(exr_image.images)[idxA][i];
        } else {
          (*out_rgba)[4 * i + 3] = 1.0;
        }
      }
    }
  }

  (*width) = exr_image.width;
  (*height) = exr_image.height;

  FreeEXRHeader(&exr_header);
  FreeEXRImage(&exr_image);

  return TINYEXR_SUCCESS;
}